

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O2

int l2_cast_octal_str_to_int(char *s)

{
  int iVar1;
  size_t sVar2;
  int ans;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_octal_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0x1e);
  sVar2 = strlen(s);
  iVar1 = (int)sVar2;
  iVar3 = 0;
  while( true ) {
    iVar1 = iVar1 + -1;
    iVar4 = 0;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    if (*s == '\0') break;
    iVar5 = 1;
    while( true ) {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) break;
      iVar5 = iVar5 << 3;
    }
    iVar3 = iVar3 + iVar5 * (*s + -0x30);
    s = s + 1;
  }
  return iVar3;
}

Assistant:

int l2_cast_octal_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        ans += factor * (*p - '0');
        n -= 1;
    }
    return ans;
}